

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint64_t farmhash64_uo_with_seed(char *s,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  ulong uVar2;
  
  if (len < 0x41) {
    uVar1 = farmhash64_na(s,len);
    uVar2 = (uVar1 + 0x651e95c4d06fbfb1 ^ seed) * -0x622015f714c7d297;
    uVar2 = (uVar2 >> 0x2f ^ seed ^ uVar2) * -0x622015f714c7d297;
    return (uVar2 ^ uVar2 >> 0x2f) * -0x622015f714c7d297;
  }
  uVar1 = farmhash64_uo_with_seeds(s,len,0,seed);
  return uVar1;
}

Assistant:

uint64_t farmhash64_uo_with_seed(const char *s, size_t len, uint64_t seed) {
  return len <= 64 ? farmhash64_na_with_seed(s, len, seed) :
      farmhash64_uo_with_seeds(s, len, 0, seed);
}